

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalDefinition.cpp
# Opt level: O0

void __thiscall license::locate::ExternalDefinition::~ExternalDefinition(ExternalDefinition *this)

{
  ExternalDefinition *this_local;
  
  LocatorStrategy::~LocatorStrategy(&this->super_LocatorStrategy);
  return;
}

Assistant:

ExternalDefinition::~ExternalDefinition() {}